

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeDistanceCalculator.cpp
# Opt level: O1

STL * cacheSurface(STL *__return_storage_ptr__,ImportedUgrid *ugrid,
                  set<int,_std::less<int>,_std::allocator<int>_> *tags)

{
  vector<Parfait::Facet,_std::allocator<Parfait::Facet>_> *this;
  _Rb_tree_header *p_Var1;
  pointer pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  pointer pdVar7;
  iterator iVar8;
  pointer piVar9;
  int *piVar10;
  _Base_ptr p_Var11;
  long lVar12;
  _Rb_tree_header *p_Var13;
  ulong uVar14;
  _Base_ptr p_Var15;
  double *pdVar16;
  Facet *pFVar17;
  iterator iVar18;
  long lVar19;
  byte bVar20;
  array<Parfait::Point<double>,_3UL> facet;
  Facet local_120;
  double local_c0 [4];
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  double local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  bVar20 = 0;
  (__return_storage_ptr__->filename)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->filename).field_2;
  (__return_storage_ptr__->filename)._M_string_length = 0;
  (__return_storage_ptr__->filename).field_2._M_local_buf[0] = '\0';
  this = &__return_storage_ptr__->facets;
  (__return_storage_ptr__->facets).
  super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->facets).
  super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->facets).
  super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  piVar9 = (ugrid->triangles).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (8 < (ulong)((long)(ugrid->triangles).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar9)) {
    p_Var1 = &(tags->_M_t)._M_impl.super__Rb_tree_header;
    lVar19 = 0;
    uVar14 = 0;
    do {
      iVar6 = (ugrid->triangleTags).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar14];
      p_Var15 = (tags->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var11 = &p_Var1->_M_header;
      for (; (_Rb_tree_header *)p_Var15 != (_Rb_tree_header *)0x0;
          p_Var15 = (&p_Var15->_M_left)[(int)*(size_t *)(p_Var15 + 1) < iVar6]) {
        if (iVar6 <= (int)*(size_t *)(p_Var15 + 1)) {
          p_Var11 = p_Var15;
        }
      }
      p_Var15 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
         (p_Var15 = p_Var11, iVar6 < (int)p_Var11[1]._M_color)) {
        p_Var15 = &p_Var1->_M_header;
      }
      if ((_Rb_tree_header *)p_Var15 != p_Var1) {
        pdVar7 = (ugrid->nodes).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar10 = (int *)((long)piVar9 + lVar19);
        lVar12 = 4;
        do {
          pdVar2 = pdVar7 + (long)*piVar10 * 3;
          dVar4 = pdVar2[1];
          dVar3 = pdVar7[(long)*piVar10 * 3 + 2];
          *(double *)((long)local_c0 + lVar12 * 4 + -0x10) = *pdVar2;
          *(double *)((long)local_c0 + lVar12 * 4 + -8) = dVar4;
          *(double *)((long)local_c0 + lVar12 * 4) = dVar3;
          piVar10 = piVar10 + 1;
          lVar12 = lVar12 + 6;
        } while (lVar12 != 0x16);
        local_68 = local_c0[2];
        local_78 = local_c0[0];
        uStack_70 = local_c0[1];
        local_50 = local_98;
        local_60 = local_c0[3];
        uStack_58 = uStack_a0;
        local_38 = local_80;
        local_48 = local_90;
        uStack_40 = uStack_88;
        pdVar16 = &local_78;
        pFVar17 = &local_120;
        for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
          (pFVar17->points)._M_elems[0].pos._M_elems[0] = *pdVar16;
          pdVar16 = pdVar16 + (ulong)bVar20 * -2 + 1;
          pFVar17 = (Facet *)((long)pFVar17 + (ulong)bVar20 * -0x10 + 8);
        }
        iVar8._M_current =
             (__return_storage_ptr__->facets).
             super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar8._M_current ==
            (__return_storage_ptr__->facets).
            super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Parfait::Facet,_std::allocator<Parfait::Facet>_>::
          _M_realloc_insert<Parfait::Facet>(this,iVar8,&local_120);
        }
        else {
          pFVar17 = &local_120;
          iVar18._M_current = iVar8._M_current;
          for (lVar12 = 0xc; lVar12 != 0; lVar12 = lVar12 + -1) {
            ((iVar18._M_current)->points)._M_elems[0].pos._M_elems[0] =
                 (pFVar17->points)._M_elems[0].pos._M_elems[0];
            pFVar17 = (Facet *)((long)pFVar17 + (ulong)bVar20 * -0x10 + 8);
            iVar18._M_current = iVar18._M_current + (ulong)bVar20 * -0x10 + 8;
          }
          (__return_storage_ptr__->facets).
          super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar8._M_current + 1;
        }
      }
      uVar14 = uVar14 + 1;
      piVar9 = (ugrid->triangles).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar19 = lVar19 + 0xc;
    } while (uVar14 < (ulong)((long)(ugrid->triangles).super__Vector_base<int,_std::allocator<int>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)piVar9 >> 2)
                      / 3);
  }
  piVar9 = (ugrid->quads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0xf < (ulong)((long)(ugrid->quads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar9)) {
    p_Var1 = &(tags->_M_t)._M_impl.super__Rb_tree_header;
    uVar14 = 0;
    do {
      iVar6 = (ugrid->quadTags).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar14];
      p_Var15 = (tags->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var11 = &p_Var1->_M_header;
      for (; (_Rb_tree_header *)p_Var15 != (_Rb_tree_header *)0x0;
          p_Var15 = (&p_Var15->_M_left)[(int)*(size_t *)(p_Var15 + 1) < iVar6]) {
        if (iVar6 <= (int)*(size_t *)(p_Var15 + 1)) {
          p_Var11 = p_Var15;
        }
      }
      p_Var13 = p_Var1;
      if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
         (p_Var13 = (_Rb_tree_header *)p_Var11,
         iVar6 < (int)((_Rb_tree_header *)p_Var11)->_M_node_count)) {
        p_Var13 = p_Var1;
      }
      if (p_Var13 != p_Var1) {
        pdVar7 = (ugrid->nodes).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar19 = (long)piVar9[uVar14 * 4 + 1];
        dVar3 = pdVar7[lVar19 * 3];
        dVar4 = pdVar7[lVar19 * 3 + 1];
        dVar5 = pdVar7[lVar19 * 3 + 2];
        local_120.points._M_elems[0].pos._M_elems[0] = pdVar7[(long)piVar9[uVar14 * 4] * 3];
        local_120.points._M_elems[0].pos._M_elems[1] = (pdVar7 + (long)piVar9[uVar14 * 4] * 3)[1];
        local_120.points._M_elems[0].pos._M_elems[2] = pdVar7[(long)piVar9[uVar14 * 4] * 3 + 2];
        local_120.points._M_elems[1].pos._M_elems[0] = dVar3;
        local_120.points._M_elems[1].pos._M_elems[1] = dVar4;
        local_120.points._M_elems[1].pos._M_elems[2] = dVar5;
        local_120.points._M_elems[2].pos._M_elems[0] = pdVar7[(long)piVar9[uVar14 * 4 + 2] * 3];
        local_120.points._M_elems[2].pos._M_elems[1] =
             (pdVar7 + (long)piVar9[uVar14 * 4 + 2] * 3)[1];
        local_120.points._M_elems[2].pos._M_elems[2] = pdVar7[(long)piVar9[uVar14 * 4 + 2] * 3 + 2];
        iVar8._M_current =
             (__return_storage_ptr__->facets).
             super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar8._M_current ==
            (__return_storage_ptr__->facets).
            super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Parfait::Facet,_std::allocator<Parfait::Facet>_>::
          _M_realloc_insert<Parfait::Facet>(this,iVar8,&local_120);
        }
        else {
          pFVar17 = &local_120;
          iVar18._M_current = iVar8._M_current;
          for (lVar19 = 0xc; lVar19 != 0; lVar19 = lVar19 + -1) {
            ((iVar18._M_current)->points)._M_elems[0].pos._M_elems[0] =
                 (pFVar17->points)._M_elems[0].pos._M_elems[0];
            pFVar17 = (Facet *)((long)pFVar17 + (ulong)bVar20 * -0x10 + 8);
            iVar18._M_current = iVar18._M_current + (ulong)bVar20 * -0x10 + 8;
          }
          (__return_storage_ptr__->facets).
          super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar8._M_current + 1;
        }
        pdVar7 = (ugrid->nodes).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_120.points._M_elems[0].pos._M_elems[0] = pdVar7[(long)piVar9[uVar14 * 4] * 3];
        local_120.points._M_elems[0].pos._M_elems[1] = (pdVar7 + (long)piVar9[uVar14 * 4] * 3)[1];
        local_120.points._M_elems[0].pos._M_elems[2] = pdVar7[(long)piVar9[uVar14 * 4] * 3 + 2];
        local_120.points._M_elems[1].pos._M_elems[0] = dVar3;
        local_120.points._M_elems[1].pos._M_elems[1] = dVar4;
        local_120.points._M_elems[1].pos._M_elems[2] = dVar5;
        local_120.points._M_elems[2].pos._M_elems[0] = pdVar7[(long)piVar9[uVar14 * 4 + 2] * 3];
        local_120.points._M_elems[2].pos._M_elems[1] =
             (pdVar7 + (long)piVar9[uVar14 * 4 + 2] * 3)[1];
        local_120.points._M_elems[2].pos._M_elems[2] = pdVar7[(long)piVar9[uVar14 * 4 + 2] * 3 + 2];
        iVar8._M_current =
             (__return_storage_ptr__->facets).
             super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar8._M_current ==
            (__return_storage_ptr__->facets).
            super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Parfait::Facet,_std::allocator<Parfait::Facet>_>::
          _M_realloc_insert<Parfait::Facet>(this,iVar8,&local_120);
        }
        else {
          pFVar17 = &local_120;
          iVar18._M_current = iVar8._M_current;
          for (lVar19 = 0xc; lVar19 != 0; lVar19 = lVar19 + -1) {
            ((iVar18._M_current)->points)._M_elems[0].pos._M_elems[0] =
                 (pFVar17->points)._M_elems[0].pos._M_elems[0];
            pFVar17 = (Facet *)((long)pFVar17 + (ulong)bVar20 * -0x10 + 8);
            iVar18._M_current = iVar18._M_current + (ulong)bVar20 * -0x10 + 8;
          }
          (__return_storage_ptr__->facets).
          super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar8._M_current + 1;
        }
      }
      uVar14 = uVar14 + 1;
      piVar9 = (ugrid->quads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar14 < (ulong)((long)(ugrid->quads).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)piVar9 >> 2)
                      >> 2);
  }
  return __return_storage_ptr__;
}

Assistant:

auto cacheSurface(const Parfait::ImportedUgrid& ugrid, const std::set<int>& tags) {
    Parfait::STL::STL stl;
    for(int t = 0; t < ugrid.triangles.size() / 3; t++) {
        auto tri = &ugrid.triangles[3 * t + 0];
        int tag = ugrid.triangleTags[t];
        if (tags.count(tag) != 0) {
            std::array<Parfait::Point<double>, 3> facet;
            for (int i = 0; i < 3; i++) {
                int n = tri[i];
                const double *p = &ugrid.nodes[3 * n + 0];
                facet[i] = Parfait::Point<double>(p[0], p[1], p[2]);
            }
            stl.facets.push_back({facet[0], facet[1], facet[2]});
        }
    }

    for(int q = 0; q < ugrid.quads.size() / 4; q++) {
        auto quad = &ugrid.quads[4 * q + 0];
        int tag = ugrid.quadTags[q];
        if (tags.count(tag) != 0) {
            std::array<Parfait::Point<double>, 3> facet;
            const double *p;
            p = &ugrid.nodes[3 * quad[0] + 0];
            facet[0] = Parfait::Point<double>(p[0], p[1], p[2]);
            p = &ugrid.nodes[3 * quad[1] + 0];
            facet[1] = Parfait::Point<double>(p[0], p[1], p[2]);
            p = &ugrid.nodes[3 * quad[2] + 0];
            facet[2] = Parfait::Point<double>(p[0], p[1], p[2]);
            stl.facets.push_back({facet[0], facet[1], facet[2]});

            p = &ugrid.nodes[3 * quad[2] + 0];
            facet[2] = Parfait::Point<double>(p[0], p[1], p[2]);
            p = &ugrid.nodes[3 * quad[3] + 0];
            facet[3] = Parfait::Point<double>(p[0], p[1], p[2]);
            p = &ugrid.nodes[3 * quad[0] + 0];
            facet[0] = Parfait::Point<double>(p[0], p[1], p[2]);
            stl.facets.push_back({facet[0], facet[1], facet[2]});
        }
    }
    return stl;
}